

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O0

ostream * wasm::operator<<(ostream *os,RepeatedSubstring *substring)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_1c;
  uint idx;
  RepeatedSubstring *substring_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"SuffixTree::RepeatedSubstring{");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,substring->Length);
  std::operator<<(poVar1,"u, (std::vector<unsigned>{");
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&substring->StartIndices)
    ;
    if (sVar2 <= local_1c) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&substring->StartIndices,(ulong)local_1c);
    std::ostream::operator<<(os,*pvVar3);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&substring->StartIndices)
    ;
    if ((ulong)local_1c != sVar2 - 1) {
      std::operator<<(os,", ");
    }
    local_1c = local_1c + 1;
  }
  poVar1 = std::operator<<(os,"})}");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os,
                                  RepeatedSubstring substring) {
    os << "SuffixTree::RepeatedSubstring{" << substring.Length
       << "u, (std::vector<unsigned>{";
    for (unsigned idx = 0; idx < substring.StartIndices.size(); idx++) {
      os << substring.StartIndices[idx];
      if (idx != substring.StartIndices.size() - 1) {
        os << ", ";
      }
    }
    return os << "})}";
  }